

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmAbc.c
# Opt level: O2

int Mpm_ManNodeIfToGia(Gia_Man_t *pNew,Mpm_Man_t *pMan,Mig_Obj_t *pObj,Vec_Int_t *vLeaves,int fHash)

{
  Mig_Man_t *pMVar1;
  Vec_Ptr_t *vVisited;
  uint uVar2;
  int iVar3;
  int iVar4;
  Mpm_Cut_t *pMVar5;
  Mig_Obj_t *pMVar6;
  Mpm_Cut_t *pMVar7;
  undefined4 *puVar8;
  ulong uVar9;
  Mpm_Man_t *format;
  
  pMVar5 = Mpm_ObjCutBestP(pMan,pObj);
  uVar2 = *(uint *)&pMVar5->field_0x4;
  if (uVar2 < 0x10000000) {
    __assert_fail("pCut->nLeaves > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mpm/mpmAbc.c"
                  ,0xc2,
                  "int Mpm_ManNodeIfToGia(Gia_Man_t *, Mpm_Man_t *, Mig_Obj_t *, Vec_Int_t *, int)")
    ;
  }
  for (uVar9 = 0; uVar9 < uVar2 >> 0x1b; uVar9 = uVar9 + 1) {
    pMVar1 = pMan->pMig;
    iVar3 = Abc_Lit2Var(pMVar5->pLeaves[uVar9]);
    pMVar6 = Mig_ManObj(pMVar1,iVar3);
    if (pMVar6 == (Mig_Obj_t *)0x0) break;
    pMVar7 = Mpm_ObjCutBestP(pMan,pMVar6);
    iVar3 = Vec_IntEntry(vLeaves,(int)uVar9);
    pMVar7->hNext = iVar3;
    uVar2 = *(uint *)&pMVar5->field_0x4;
  }
  vVisited = pMan->vTemp;
  vVisited->nSize = 0;
  format = pMan;
  iVar3 = Mpm_ManNodeIfToGia_rec(pNew,pMan,pObj,vVisited,fHash);
  if (iVar3 == -1) {
    Abc_Print((int)pNew,(char *)format);
  }
  else {
    for (uVar9 = 0; uVar9 < *(uint *)&pMVar5->field_0x4 >> 0x1b; uVar9 = uVar9 + 1) {
      pMVar1 = pMan->pMig;
      iVar4 = Abc_Lit2Var(pMVar5->pLeaves[uVar9]);
      pMVar6 = Mig_ManObj(pMVar1,iVar4);
      if (pMVar6 == (Mig_Obj_t *)0x0) break;
      pMVar7 = Mpm_ObjCutBestP(pMan,pMVar6);
      pMVar7->hNext = 0;
    }
    for (iVar4 = 0; iVar4 < pMan->vTemp->nSize; iVar4 = iVar4 + 1) {
      puVar8 = (undefined4 *)Vec_PtrEntry(pMan->vTemp,iVar4);
      *puVar8 = 0;
    }
  }
  return iVar3;
}

Assistant:

int Mpm_ManNodeIfToGia( Gia_Man_t * pNew, Mpm_Man_t * pMan, Mig_Obj_t * pObj, Vec_Int_t * vLeaves, int fHash )
{
    Mpm_Cut_t * pCut;
    Mig_Obj_t * pFanin;
    int i, iRes;
    // get the best cut
    pCut = Mpm_ObjCutBestP( pMan, pObj );
    assert( pCut->nLeaves > 1 );
    // set the leaf variables
    Mpm_CutForEachLeaf( pMan->pMig, pCut, pFanin, i )
        Mpm_CutSetDataInt( Mpm_ObjCutBestP(pMan, pFanin), Vec_IntEntry(vLeaves, i) );
    // recursively compute the function while collecting visited cuts
    Vec_PtrClear( pMan->vTemp );
    iRes = Mpm_ManNodeIfToGia_rec( pNew, pMan, pObj, pMan->vTemp, fHash ); 
    if ( iRes == ~0 )
    {
        Abc_Print( -1, "Mpm_ManNodeIfToGia(): Computing local AIG has failed.\n" );
        return ~0;
    }
    // clean the cuts
    Mpm_CutForEachLeaf( pMan->pMig, pCut, pFanin, i )
        Mpm_CutSetDataInt( Mpm_ObjCutBestP(pMan, pFanin), 0 );
    Vec_PtrForEachEntry( Mpm_Cut_t *, pMan->vTemp, pCut, i )
        Mpm_CutSetDataInt( pCut, 0 );
    return iRes;
}